

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::
     SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start)

{
  int iVar1;
  type_conflict5 tVar2;
  uint uVar3;
  int iVar4;
  undefined4 in_register_0000000c;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int local_1ac;
  ulong local_1a8;
  long local_1a0;
  long local_198;
  IdxCompare *local_190;
  ulong local_188;
  IdxElement tempkey;
  IdxElement local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d4;
  IdxElement local_84;
  
  local_1a8 = CONCAT44(in_register_0000000c,start);
  local_1a0 = (long)end;
  uVar3 = 2;
  local_190 = compare;
  do {
    if ((int)uVar3 < 0) {
      return;
    }
    uVar8 = (ulong)(uint)SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxCompare>
                         ::incs[uVar3];
    iVar4 = SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxCompare>
            ::incs[uVar3] + (int)local_1a8;
    uVar7 = local_1a8 & 0xffffffff;
    local_188 = uVar8;
    for (local_198 = (long)iVar4; local_198 <= local_1a0; local_198 = local_198 + 1) {
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::IdxElement(&tempkey,keys + local_198);
      iVar5 = (int)uVar7;
      while (iVar1 = (int)uVar7, iVar6 = (int)uVar8 + iVar1, iVar4 <= iVar6) {
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_128,&tempkey);
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::IdxElement(&local_84,keys + iVar1);
        uVar8 = local_188;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxCompare::operator()(&local_d4,local_190,&local_128,&local_84);
        local_1ac = 0;
        tVar2 = boost::multiprecision::operator<(&local_d4,&local_1ac);
        if (!tVar2) break;
        SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::IdxElement::operator=(keys + iVar6,keys + iVar1);
        uVar7 = (ulong)(uint)(iVar1 - (int)uVar8);
      }
      SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::IdxElement::operator=(keys + iVar6,&tempkey);
      uVar7 = (ulong)(iVar5 + 1);
    }
    uVar3 = uVar3 - 1;
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}